

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

simdjson_result<simdjson::dom::element> * __thiscall
simdjson::dom::object::at_key
          (simdjson_result<simdjson::dom::element> *__return_storage_ptr__,object *this,
          string_view key)

{
  bool bVar1;
  iterator iVar2;
  iterator field;
  iterator local_38;
  
  iVar2 = end(this);
  local_38.tape.doc = (this->tape).doc;
  local_38.tape.json_index = (this->tape).json_index + 1;
  while( true ) {
    if (local_38.tape.json_index == iVar2.tape.json_index) {
      (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
      super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.doc = (document *)0x0;
      (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
      super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.json_index = 0;
      (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
      super_pair<simdjson::dom::element,_simdjson::error_code>.second = NO_SUCH_FIELD;
      return __return_storage_ptr__;
    }
    bVar1 = iterator::key_equals(&local_38,key);
    if (bVar1) break;
    iterator::operator++(&local_38);
  }
  (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
  super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.doc = local_38.tape.doc;
  (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
  super_pair<simdjson::dom::element,_simdjson::error_code>.first.tape.json_index =
       local_38.tape.json_index + 1;
  (__return_storage_ptr__->super_simdjson_result_base<simdjson::dom::element>).
  super_pair<simdjson::dom::element,_simdjson::error_code>.second = SUCCESS;
  return __return_storage_ptr__;
}

Assistant:

inline simdjson_result<element> object::at_key(std::string_view key) const noexcept {
  iterator end_field = end();
  for (iterator field = begin(); field != end_field; ++field) {
    if (field.key_equals(key)) {
      return field.value();
    }
  }
  return NO_SUCH_FIELD;
}